

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O1

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::sphereTest
          (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *__return_storage_ptr__,
          TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,float radius,
          bool allowHitSurface)

{
  undefined8 uVar1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar3;
  float fVar4;
  undefined1 auVar5 [16];
  _Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *p_Var6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar14;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar18;
  undefined1 in_register_00001384 [60];
  undefined1 auVar19 [64];
  float fVar20;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  
  auVar19._4_60_ = in_register_00001384;
  auVar19._0_4_ = radius;
  aVar18 = center.field_2;
  auVar17._8_56_ = center._8_56_;
  auVar17._0_8_ = center._0_8_;
  aVar15 = rayDir.field_2;
  aVar14 = raySource.field_2;
  auVar13._8_56_ = raySource._8_56_;
  auVar13._0_8_ = raySource._0_8_;
  fVar8 = aVar14.z - aVar18.z;
  auVar7 = auVar17._0_16_;
  auVar21 = vsubps_avx(auVar13._0_16_,auVar7);
  aVar2 = rayDir.field_0;
  fVar20 = auVar21._0_4_;
  auVar25._0_4_ = fVar20 * aVar2.x;
  aVar3 = rayDir.field_1;
  fVar22 = auVar21._4_4_;
  auVar25._4_4_ = fVar22 * aVar3.y;
  fVar10 = rayDir.field_2;
  fVar23 = auVar21._8_4_;
  auVar25._8_4_ = fVar23 * fVar10;
  fVar4 = rayDir._12_4_;
  fVar24 = auVar21._12_4_;
  auVar25._12_4_ = fVar24 * fVar4;
  auVar21 = vhaddps_avx(auVar25,auVar25);
  fVar9 = fVar8 * aVar15.z + auVar21._0_4_;
  auVar21._0_4_ = fVar20 * fVar20;
  auVar21._4_4_ = fVar22 * fVar22;
  auVar21._8_4_ = fVar23 * fVar23;
  auVar21._12_4_ = fVar24 * fVar24;
  auVar21 = vhaddps_avx(auVar21,auVar21);
  fVar9 = fVar9 + fVar9;
  auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ + fVar8 * fVar8)),auVar19._0_16_,
                             auVar19._0_16_);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * -4.0)),ZEXT416((uint)fVar9),
                            ZEXT416((uint)fVar9));
  fVar8 = auVar21._0_4_;
  if (fVar8 < 1e-06 || !allowHitSurface) {
    auVar21 = vsubps_avx(auVar7,auVar13._0_16_);
    auVar11._0_4_ = auVar21._0_4_ * aVar2.x;
    auVar11._4_4_ = auVar21._4_4_ * aVar3.y;
    auVar11._8_4_ = auVar21._8_4_ * fVar10;
    auVar11._12_4_ = auVar21._12_4_ * fVar4;
    auVar21 = vhaddps_avx(auVar11,auVar11);
    fVar9 = (aVar18.z - aVar14.z) * aVar15.z + auVar21._0_4_;
    if (0.0 <= fVar9) {
      fVar8 = fVar9 * aVar15.z + aVar14.z;
      auVar16._0_4_ = raySource.field_0.x + fVar9 * aVar2.x;
      auVar16._4_4_ = raySource.field_1.y + fVar9 * aVar3.y;
      auVar16._8_4_ = raySource.field_2 + fVar9 * fVar10;
      auVar16._12_4_ = raySource._12_4_ + fVar9 * fVar4;
      auVar21 = vsubps_avx(auVar16,auVar7);
      auVar7._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar7._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar7._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar7._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar21 = vhaddps_avx(auVar7,auVar7);
      fVar10 = (fVar8 - aVar18.z) * (fVar8 - aVar18.z) + auVar21._0_4_;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
        auVar19 = ZEXT464((uint)radius);
      }
      else {
        auVar21 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
        fVar10 = auVar21._0_4_;
      }
      fVar10 = fVar10 - auVar19._0_4_;
      uVar1 = vmovlps_avx(auVar16);
      p_Var6 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
      goto LAB_00238039;
    }
  }
  else {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(ZEXT416((uint)fVar9),auVar5);
    if (fVar8 < 0.0) {
      fVar9 = sqrtf(fVar8);
    }
    else {
      auVar21 = vsqrtss_avx(auVar21,auVar21);
      fVar9 = auVar21._0_4_;
    }
    fVar9 = (auVar7._0_4_ - fVar9) * 0.5;
    if (0.0 <= fVar9) {
      auVar12._0_4_ = raySource.field_0.x + fVar9 * aVar2.x;
      auVar12._4_4_ = raySource.field_1.y + fVar9 * aVar3.y;
      auVar12._8_4_ = raySource.field_2 + fVar9 * fVar10;
      auVar12._12_4_ = raySource._12_4_ + fVar9 * fVar4;
      fVar8 = fVar9 * aVar15.z + aVar14.z;
      uVar1 = vmovlps_avx(auVar12);
      p_Var6 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
      fVar10 = 0.0;
      goto LAB_00238039;
    }
  }
  p_Var6 = &(__return_storage_ptr__->
            super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
            super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
  (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  fVar9 = -1.0;
  fVar10 = INFINITY;
  fVar8 = 0.0;
LAB_00238039:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z = fVar8
  ;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<1UL,_float,_false>._M_head_impl = fVar10;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<0UL,_float,_false>._M_head_impl = fVar9;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::sphereTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                    glm::vec3 center, float radius,
                                                                    bool allowHitSurface) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  glm::vec3 oc = raySource - center;
  float b = 2. * dot(oc, rayDir);
  float c = glm::dot(oc, oc) - radius * radius;
  float disc = b * b - 4 * c;
  if (disc < 1e-6 || !allowHitSurface) {
    // miss, return nearest point
    float tHit = glm::dot(rayDir, center - raySource);
    if (tHit < 0.) {
      // hit behind
      return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}};
    }
    glm::vec3 hitPoint = raySource + tHit * rayDir;
    return ret_t{tHit, glm::length(hitPoint - center) - radius, hitPoint};
  } else {
    // actual hit
    float tHit = (-b - std::sqrt(disc)) / 2.;
    if (tHit < 0.) {
      // hit behind
      return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}};
    }
    return ret_t{tHit, 0, raySource + tHit * rayDir};
  }
}